

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::push_back
          (SubroutineFunctionSet *this,SubroutineFunction *_fn)

{
  pointer *ppSVar1;
  allocator_type *__a;
  undefined8 *puVar2;
  undefined8 *puVar3;
  SubroutineFunction *this_00;
  SubroutineFunction *pSVar4;
  allocator_type *paVar5;
  SubroutineFunction *__p;
  undefined8 uVar6;
  ulong uVar7;
  pointer pSVar8;
  char *pcVar9;
  ulong uVar10;
  allocator_type *paVar11;
  SubroutineFunction *pSVar12;
  long lVar13;
  _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  *this_01;
  long lVar14;
  pointer pSVar15;
  
  this_00 = (this->fn).
            super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 ==
      (this->fn).
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pSVar4 = (this->fn).
             super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)this_00 - (long)pSVar4;
    if (lVar13 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (lVar13 >> 3) * 0xf83e0f83e0f83e1;
    uVar7 = 1;
    if (this_00 != pSVar4) {
      uVar7 = uVar10;
    }
    this_01 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               *)(uVar7 + uVar10);
    if ((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
         *)0x7c1f07c1f07c1e < this_01) {
      this_01 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 *)0x7c1f07c1f07c1f;
    }
    if (CARRY8(uVar7,uVar10)) {
      this_01 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 *)0x7c1f07c1f07c1f;
    }
    pSVar8 = std::
             _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ::_M_allocate(this_01,(size_t)_fn);
    SubroutineFunction::SubroutineFunction((SubroutineFunction *)(lVar13 + (long)pSVar8),_fn);
    pSVar15 = pSVar8;
    if (this_00 != pSVar4) {
      lVar13 = 0;
      do {
        lVar14 = lVar13;
        __a = (allocator_type *)((long)&(pSVar4->index).super_LayoutSpecifierBase.val + lVar14);
        *(undefined4 *)
         ((long)&(pSVar8->index).super_LayoutSpecifierBase.occurence.occurence + lVar14) =
             *(undefined4 *)
              ((long)&(pSVar4->index).super_LayoutSpecifierBase.occurence.occurence + lVar14);
        *(undefined8 *)((long)&(pSVar8->index).super_LayoutSpecifierBase.val + lVar14) =
             *(undefined8 *)((long)&(pSVar4->index).super_LayoutSpecifierBase.val + lVar14);
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).fValues.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)
                 ((long)&(pSVar8->embeddedRetVal).fValues.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(undefined8 *)
         ((long)&(pSVar8->embeddedRetVal).fValues.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) =
             *(undefined8 *)
              ((long)&(pSVar4->embeddedRetVal).fValues.
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + lVar14);
        *(undefined8 *)
         ((long)&(pSVar4->embeddedRetVal).fValues.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).fValues.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).iValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)
                 ((long)&(pSVar8->embeddedRetVal).iValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(undefined8 *)
         ((long)&(pSVar8->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) =
             *(undefined8 *)
              ((long)&(pSVar4->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14);
        *(undefined8 *)
         ((long)&(pSVar4->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).iValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).uValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)
                 ((long)&(pSVar8->embeddedRetVal).uValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(undefined8 *)
         ((long)&(pSVar8->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) =
             *(undefined8 *)
              ((long)&(pSVar4->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14);
        *(undefined8 *)
         ((long)&(pSVar4->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).uValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined4 *)((long)&(pSVar8->embeddedRetVal).type.enumType + lVar14) =
             *(undefined4 *)((long)&(pSVar4->embeddedRetVal).type.enumType + lVar14);
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).type.arraySizesSegmented.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)
                 ((long)&(pSVar8->embeddedRetVal).type.arraySizesSegmented.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(undefined8 *)
         ((long)&(pSVar8->embeddedRetVal).type.arraySizesSegmented.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + lVar14) =
             *(undefined8 *)
              ((long)&(pSVar4->embeddedRetVal).type.arraySizesSegmented.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage + lVar14);
        *(undefined8 *)
         ((long)&(pSVar4->embeddedRetVal).type.arraySizesSegmented.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + lVar14) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).type.arraySizesSegmented.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined4 *)((long)&(pSVar8->embeddedRetVal).type.arraySize + lVar14) =
             *(undefined4 *)((long)&(pSVar4->embeddedRetVal).type.arraySize + lVar14);
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).type.childTypes.
                         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)
                 ((long)&(pSVar8->embeddedRetVal).type.childTypes.
                         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(undefined8 *)
         ((long)&(pSVar8->embeddedRetVal).type.childTypes.
                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) =
             *(undefined8 *)
              ((long)&(pSVar4->embeddedRetVal).type.childTypes.
                      super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14);
        *(undefined8 *)
         ((long)&(pSVar4->embeddedRetVal).type.childTypes.
                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar4->embeddedRetVal).type.childTypes.
                         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        pcVar9 = (pSVar8->embeddedRetVal).type.strType.field_2._M_local_buf + lVar14;
        *(char **)((long)&(pSVar8->embeddedRetVal).type.strType._M_dataplus._M_p + lVar14) = pcVar9;
        paVar5 = *(allocator_type **)
                  ((long)&(pSVar4->embeddedRetVal).type.strType._M_dataplus._M_p + lVar14);
        paVar11 = __a + 0xa8;
        if (paVar11 == paVar5) {
          uVar6 = *(undefined8 *)(__a + 0xb0);
          *(undefined8 *)pcVar9 = *(undefined8 *)paVar11;
          *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.strType.field_2 + lVar14 + 8) = uVar6
          ;
        }
        else {
          *(allocator_type **)
           ((long)&(pSVar8->embeddedRetVal).type.strType._M_dataplus._M_p + lVar14) = paVar5;
          *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.strType.field_2 + lVar14) =
               *(undefined8 *)paVar11;
        }
        *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.strType._M_string_length + lVar14) =
             *(undefined8 *)((long)&(pSVar4->embeddedRetVal).type.strType._M_string_length + lVar14)
        ;
        *(allocator_type **)((long)&(pSVar4->embeddedRetVal).type.strType._M_dataplus._M_p + lVar14)
             = paVar11;
        *(undefined8 *)((long)&(pSVar4->embeddedRetVal).type.strType._M_string_length + lVar14) = 0;
        (pSVar4->embeddedRetVal).type.strType.field_2._M_local_buf[lVar14] = '\0';
        pcVar9 = (pSVar8->embeddedRetVal).type.refStrType.field_2._M_local_buf + lVar14;
        *(char **)((long)&(pSVar8->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar14) =
             pcVar9;
        __p = *(SubroutineFunction **)
               ((long)&(pSVar4->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar14);
        pSVar12 = (SubroutineFunction *)(__a + 200);
        if (pSVar12 == __p) {
          uVar6 = *(undefined8 *)(__a + 0xd0);
          *(undefined8 *)pcVar9 = *(undefined8 *)&(pSVar12->index).super_LayoutSpecifierBase;
          *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.refStrType.field_2 + lVar14 + 8) =
               uVar6;
        }
        else {
          *(SubroutineFunction **)
           ((long)&(pSVar8->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar14) = __p;
          *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.refStrType.field_2 + lVar14) =
               *(undefined8 *)&(pSVar12->index).super_LayoutSpecifierBase;
        }
        *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.refStrType._M_string_length + lVar14) =
             *(undefined8 *)
              ((long)&(pSVar4->embeddedRetVal).type.refStrType._M_string_length + lVar14);
        *(SubroutineFunction **)
         ((long)&(pSVar4->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar14) = pSVar12;
        *(undefined8 *)((long)&(pSVar4->embeddedRetVal).type.refStrType._M_string_length + lVar14) =
             0;
        (pSVar4->embeddedRetVal).type.refStrType.field_2._M_local_buf[lVar14] = '\0';
        uVar6 = *(undefined8 *)((long)&(pSVar4->embeddedRetVal).type.size.first + lVar14);
        *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.size.second + lVar14 + 2) =
             *(undefined8 *)((long)&(pSVar4->embeddedRetVal).type.size.second + lVar14 + 2);
        *(undefined8 *)((long)&(pSVar8->embeddedRetVal).type.size.first + lVar14) = uVar6;
        pcVar9 = (pSVar8->name).field_2._M_local_buf + lVar14;
        *(char **)((long)&(pSVar8->name)._M_dataplus._M_p + lVar14) = pcVar9;
        paVar5 = *(allocator_type **)((long)&(pSVar4->name)._M_dataplus._M_p + lVar14);
        paVar11 = __a + 0xf8;
        if (paVar11 == paVar5) {
          uVar6 = *(undefined8 *)(__a + 0x100);
          *(undefined8 *)pcVar9 = *(undefined8 *)paVar11;
          *(undefined8 *)((long)&(pSVar8->name).field_2 + lVar14 + 8) = uVar6;
        }
        else {
          *(allocator_type **)((long)&(pSVar8->name)._M_dataplus._M_p + lVar14) = paVar5;
          *(undefined8 *)((long)&(pSVar8->name).field_2 + lVar14) = *(undefined8 *)paVar11;
        }
        *(undefined8 *)((long)&(pSVar8->name)._M_string_length + lVar14) =
             *(undefined8 *)((long)&(pSVar4->name)._M_string_length + lVar14);
        *(allocator_type **)((long)&(pSVar4->name)._M_dataplus._M_p + lVar14) = paVar11;
        *(undefined8 *)((long)&(pSVar4->name)._M_string_length + lVar14) = 0;
        (pSVar4->name).field_2._M_local_buf[lVar14] = '\0';
        std::allocator_traits<std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>::
        destroy<glcts::(anonymous_namespace)::SubroutineFunction>(__a,__p);
        lVar13 = lVar14 + 0x108;
      } while ((SubroutineFunction *)((long)&pSVar4[1].index.super_LayoutSpecifierBase.val + lVar14)
               != this_00);
      pSVar15 = (pointer)((long)&pSVar8[1].index.super_LayoutSpecifierBase.val + lVar14);
    }
    if (pSVar4 != (SubroutineFunction *)0x0) {
      operator_delete(pSVar4,(long)(this->fn).
                                   super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar4
                     );
    }
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar8;
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar15 + 1;
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar8 + (long)this_01;
  }
  else {
    SubroutineFunction::SubroutineFunction(this_00,_fn);
    ppSVar1 = &(this->fn).
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return;
}

Assistant:

void push_back(const SubroutineFunction& _fn)
	{
		fn.push_back(_fn);
	}